

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralLinearAction::~IfcStructuralLinearAction
          (IfcStructuralLinearAction *this)

{
  undefined1 *puVar1;
  IfcStructuralActivity *this_00;
  long *plVar2;
  long lVar3;
  
  lVar3 = *(long *)(*(long *)&(this->super_IfcStructuralAction).super_IfcStructuralActivity.
                              super_IfcProduct.super_IfcObject + -0x18);
  this_00 = (IfcStructuralActivity *)
            (&(this->super_IfcStructuralAction).super_IfcStructuralActivity.super_IfcProduct.
              super_IfcObject.field_0x0 + lVar3);
  plVar2 = (long *)(&this->field_0x198 + lVar3);
  plVar2[-0x33] = 0x88ca70;
  plVar2[2] = 0x88cb88;
  plVar2[-0x22] = 0x88ca98;
  plVar2[-0x20] = 0x88cac0;
  plVar2[-0x19] = 0x88cae8;
  plVar2[-0x13] = 0x88cb10;
  plVar2[-0xc] = 0x88cb38;
  plVar2[-4] = 0x88cb60;
  if ((long *)plVar2[-2] != plVar2) {
    operator_delete((long *)plVar2[-2],*plVar2 + 1);
  }
  *(undefined8 *)&(this_00->super_IfcProduct).super_IfcObject = 0x88cd38;
  *(undefined8 *)&this_00[1].super_IfcProduct.super_IfcObject.field_0x58 = 0x88ce28;
  *(undefined8 *)&(this_00->super_IfcProduct).super_IfcObject.field_0x88 = 0x88cd60;
  (this_00->super_IfcProduct).super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x88cd88;
  *(undefined8 *)&(this_00->super_IfcProduct).super_IfcObject.field_0xd0 = 0x88cdb0;
  *(undefined8 *)&(this_00->super_IfcProduct).field_0x100 = 0x88cdd8;
  *(undefined8 *)&this_00->field_0x138 = 0x88ce00;
  puVar1 = &this_00[1].super_IfcProduct.super_IfcObject.field_0x8;
  if (*(undefined1 **)&this_00->field_0x148 != puVar1) {
    operator_delete(*(undefined1 **)&this_00->field_0x148,*(long *)puVar1 + 1);
  }
  IfcStructuralActivity::~IfcStructuralActivity(this_00,&PTR_construction_vtable_24__0088cba8);
  operator_delete(this_00,0x1c0);
  return;
}

Assistant:

IfcStructuralLinearAction() : Object("IfcStructuralLinearAction") {}